

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void highbd_write_buffer_4xn_sse4_1
               (__m128i *in,uint16_t *output,int stride,int flipud,int height,int bd)

{
  int iVar1;
  ulong uVar2;
  __m128i *palVar3;
  ulong uVar4;
  uint16_t *puVar5;
  bool bVar6;
  undefined1 in_XMM0 [16];
  __m128i x0;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 extraout_XMM0 [16];
  __m128i alVar9;
  
  uVar2 = (ulong)(uint)stride;
  iVar1 = height + -1;
  if (flipud == 0) {
    iVar1 = 0;
  }
  uVar4 = 0;
  if (0 < height) {
    uVar4 = (ulong)(uint)height;
  }
  palVar3 = in + iVar1;
  puVar5 = output;
  while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
    auVar7 = pmovsxwd(in_XMM0,*(undefined8 *)puVar5);
    auVar8._0_4_ = auVar7._0_4_ + (int)(*palVar3)[0];
    auVar8._4_4_ = auVar7._4_4_ + *(int *)((long)*palVar3 + 4);
    auVar8._8_4_ = auVar7._8_4_ + (int)(*palVar3)[1];
    auVar8._12_4_ = auVar7._12_4_ + *(int *)((long)*palVar3 + 0xc);
    packusdw(auVar8,auVar8);
    alVar9[0] = (ulong)(uint)bd;
    alVar9[1] = (longlong)output;
    alVar9 = highbd_clamp_epi16(alVar9,(int)uVar2);
    uVar2 = alVar9[1];
    *(long *)puVar5 = extraout_XMM0._0_8_;
    palVar3 = palVar3 + (ulong)(flipud == 0) * 2 + -1;
    puVar5 = puVar5 + stride;
    in_XMM0 = extraout_XMM0;
  }
  return;
}

Assistant:

static inline void highbd_write_buffer_4xn_sse4_1(__m128i *in, uint16_t *output,
                                                  int stride, int flipud,
                                                  int height, const int bd) {
  int j = flipud ? (height - 1) : 0;
  const int step = flipud ? -1 : 1;
  for (int i = 0; i < height; ++i, j += step) {
    __m128i v = _mm_loadl_epi64((__m128i const *)(output + i * stride));
    __m128i u = highbd_get_recon_4xn_sse4_1(v, in[j], bd);

    _mm_storel_epi64((__m128i *)(output + i * stride), u);
  }
}